

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QStringList * __thiscall
QRegularExpressionMatch::capturedTexts
          (QStringList *__return_storage_ptr__,QRegularExpressionMatch *this)

{
  int nth;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  QList<QString>::reserve(__return_storage_ptr__,(long)((this->d).d.ptr)->capturedCount);
  for (nth = 0; nth < ((this->d).d.ptr)->capturedCount; nth = nth + 1) {
    captured((QString *)&local_40,this,nth);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QRegularExpressionMatch::capturedTexts() const
{
    QStringList texts;
    texts.reserve(d->capturedCount);
    for (int i = 0; i < d->capturedCount; ++i)
        texts << captured(i);
    return texts;
}